

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeating_task.cc
# Opt level: O3

void __thiscall
dd::RepeatingTaskBase::RepeatingTaskBase
          (RepeatingTaskBase *this,TaskQueueBase *task_queue,int64_t first_delay)

{
  long lVar1;
  
  (this->super_QueuedTask)._vptr_QueuedTask = (_func_int **)&PTR__RepeatingTaskBase_0012ec20;
  this->_task_queue = task_queue;
  lVar1 = std::chrono::_V2::system_clock::now();
  this->_next_run_time = lVar1 / 1000000 + first_delay;
  return;
}

Assistant:

RepeatingTaskBase::RepeatingTaskBase(TaskQueueBase* task_queue,
		int64_t first_delay)
		: _task_queue(task_queue),
		_next_run_time(GetCurrentTick() + first_delay) {}